

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

int cppcms_capi_session_pool_init_from_json(cppcms_capi_session_pool *pool,char *json)

{
  bool bVar1;
  ostream *this;
  runtime_error *this_00;
  session_pool *p;
  session_pool *this_01;
  char *in_RSI;
  long in_RDI;
  ostringstream ss;
  int line;
  istringstream f;
  value v;
  int *in_stack_fffffffffffffc50;
  undefined8 in_stack_fffffffffffffc58;
  undefined1 full;
  istream *in_stack_fffffffffffffc60;
  value *in_stack_fffffffffffffc68;
  string local_370 [24];
  value *in_stack_fffffffffffffca8;
  session_pool *in_stack_fffffffffffffcb0;
  allocator local_1d1;
  string local_1d0 [32];
  istringstream local_1b0 [408];
  char *local_18;
  long local_10;
  int local_4;
  
  full = (undefined1)((ulong)in_stack_fffffffffffffc58 >> 0x38);
  if (in_RDI == 0) {
    local_4 = -1;
  }
  else {
    local_18 = in_RSI;
    local_10 = in_RDI;
    anon_unknown.dwarf_2860d0::check_str((char *)in_stack_fffffffffffffc60);
    cppcms::json::value::value((value *)0x47871e);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d0,local_18,&local_1d1);
    std::__cxx11::istringstream::istringstream(local_1b0,local_1d0,_S_in);
    std::__cxx11::string::~string(local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    bVar1 = cppcms::json::value::load
                      (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,(bool)full,
                       in_stack_fffffffffffffc50);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffcb0);
      this = std::operator<<((ostream *)&stack0xfffffffffffffcb0,
                             "Failed to parse json syntax error in line ");
      std::ostream::operator<<(this,0);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(this_00,local_370);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    p = (session_pool *)operator_new(0x28);
    cppcms::session_pool::session_pool(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    booster::hold_ptr<cppcms::session_pool>::reset
              ((hold_ptr<cppcms::session_pool> *)in_stack_fffffffffffffc60,p);
    this_01 = booster::hold_ptr<cppcms::session_pool>::operator->
                        ((hold_ptr<cppcms::session_pool> *)(local_10 + 0x70));
    cppcms::session_pool::init(this_01,(EVP_PKEY_CTX *)p);
    std::__cxx11::istringstream::~istringstream(local_1b0);
    cppcms::json::value::~value((value *)0x4789ca);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int cppcms_capi_session_pool_init_from_json(cppcms_capi_session_pool *pool,char const *json)
{
	try {
		if(!pool)
			return -1;
		check_str(json);
		cppcms::json::value v;
		std::istringstream f(json);
		int line = 0;
		if(!v.load(f,true,&line)) {
			std::ostringstream ss;
			ss << "Failed to parse json syntax error in line " << line;
			throw std::runtime_error(ss.str());
		}
		pool->p.reset(new cppcms::session_pool(v));
		pool->p->init();
	} CATCH(pool,0,-1);
}